

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_1,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  RTCRayQueryContext *pRVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 (*pauVar16) [16];
  undefined4 uVar17;
  int iVar18;
  undefined4 uVar19;
  ulong uVar20;
  RayHit *pRVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined8 uVar27;
  ulong uVar28;
  RayHit *pRVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined8 uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined8 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar79;
  float fVar80;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar97;
  float fVar100;
  float fVar101;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1271;
  undefined1 (*local_1270) [16];
  ulong local_1268;
  ulong local_1260;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  RayQueryContext *local_1248;
  undefined1 local_123c [8];
  float fStack_1234;
  undefined4 uStack_1230;
  undefined1 auStack_122c [16];
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  undefined1 auStack_120c [8];
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  RTCFilterFunctionNArguments local_11f8;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  ulong local_11a8;
  ulong local_11a0;
  ulong local_1198;
  ulong local_1190;
  ulong local_1188;
  ulong local_1180;
  float local_1178;
  float local_1174;
  float local_1170;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 local_1164;
  uint local_1160;
  uint local_115c;
  uint local_1158;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 *local_10f8;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  float local_10b8 [4];
  float local_10a8 [4];
  float local_1098 [4];
  float local_1088 [4];
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1270 = (undefined1 (*) [16])local_f68;
      fVar59 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_1018 = 0.0;
      if (0.0 <= fVar59) {
        local_1018 = fVar59;
      }
      aVar5 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar59 = (ray->super_RayK<1>).tfar;
      fVar124 = 0.0;
      if (0.0 <= fVar59) {
        fVar124 = fVar59;
      }
      uVar34 = -(uint)(1e-18 <= ABS(aVar5.x));
      uVar35 = -(uint)(1e-18 <= ABS(aVar5.y));
      uVar39 = -(uint)(1e-18 <= ABS(aVar5.z));
      local_1058 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1068 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_1038 = (ray->super_RayK<1>).org.field_0.m128[2];
      auVar66 = divps(_DAT_01feca10,(undefined1  [16])aVar5);
      local_1148 = (float)(~uVar34 & 0x5d5e0b6b | auVar66._0_4_ & uVar34);
      local_11c8 = (float)(~uVar35 & 0x5d5e0b6b | auVar66._4_4_ & uVar35);
      local_1028 = (float)(~uVar39 & 0x5d5e0b6b | auVar66._8_4_ & uVar39);
      local_1078 = local_1148 * 0.99999964;
      local_1138 = local_11c8 * 0.99999964;
      local_1048 = local_1028 * 0.99999964;
      local_1148 = local_1148 * 1.0000004;
      local_11c8 = local_11c8 * 1.0000004;
      local_1028 = local_1028 * 1.0000004;
      local_1190 = (ulong)(local_1078 < 0.0) << 4;
      local_1198 = (ulong)(local_1138 < 0.0) << 4 | 0x20;
      local_11a0 = (ulong)(local_1048 < 0.0) << 4 | 0x40;
      uVar24 = local_1198 ^ 0x10;
      uVar25 = local_11a0 ^ 0x10;
      auVar66._4_4_ = fVar124;
      auVar66._0_4_ = fVar124;
      auVar66._8_4_ = fVar124;
      auVar66._12_4_ = fVar124;
      _local_1008 = mm_lookupmask_ps._240_8_;
      _uStack_1000 = mm_lookupmask_ps._248_8_;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      fStack_1074 = local_1078;
      fStack_1070 = local_1078;
      fStack_106c = local_1078;
      fStack_1134 = local_1138;
      fStack_1130 = local_1138;
      fStack_112c = local_1138;
      fStack_1144 = local_1148;
      fStack_1140 = local_1148;
      fStack_113c = local_1148;
      fStack_11c4 = local_11c8;
      fStack_11c0 = local_11c8;
      fStack_11bc = local_11c8;
      local_11a8 = local_1190 ^ 0x10;
      uVar20 = local_1190;
      uVar22 = local_1190 ^ 0x10;
      uVar28 = local_11a0;
      uVar32 = local_1198;
      fVar59 = local_1018;
      fVar124 = local_1018;
      fVar120 = local_1018;
      fVar91 = local_1018;
      fVar96 = local_1038;
      fVar46 = local_1038;
      fVar47 = local_1038;
      fVar48 = local_1038;
      fVar51 = local_1058;
      fVar52 = local_1058;
      fVar53 = local_1058;
      fVar54 = local_1058;
      fVar55 = local_11c8;
      fVar56 = local_11c8;
      fVar57 = local_11c8;
      fVar58 = local_11c8;
      fVar72 = local_1138;
      fVar79 = local_1138;
      fVar80 = local_1138;
      fVar81 = local_1138;
      fVar97 = local_1148;
      fVar100 = local_1148;
      fVar101 = local_1148;
      fVar102 = local_1148;
      fVar103 = local_1028;
      fVar105 = local_1028;
      fVar106 = local_1028;
      fVar107 = local_1028;
      fVar109 = local_1048;
      fVar110 = local_1048;
      fVar111 = local_1048;
      fVar112 = local_1048;
      fVar113 = local_1068;
      fVar114 = local_1068;
      fVar115 = local_1068;
      fVar116 = local_1068;
      fVar117 = local_1078;
      fVar118 = local_1078;
      fVar119 = local_1078;
      fVar121 = local_1078;
      local_1268 = uVar25;
      local_1260 = uVar24;
      local_1248 = context;
      do {
        do {
          do {
            if (local_1270 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar16 = local_1270 + -1;
            local_1270 = local_1270 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar16 + 8));
          uVar31 = *(ulong *)*local_1270;
          do {
            if ((uVar31 & 8) == 0) {
              pfVar1 = (float *)(uVar31 + 0x20 + uVar20);
              auVar60._0_4_ = (*pfVar1 - fVar51) * fVar117;
              auVar60._4_4_ = (pfVar1[1] - fVar52) * fVar118;
              auVar60._8_4_ = (pfVar1[2] - fVar53) * fVar119;
              auVar60._12_4_ = (pfVar1[3] - fVar54) * fVar121;
              pfVar1 = (float *)(uVar31 + 0x20 + uVar32);
              auVar93._0_4_ = (*pfVar1 - fVar113) * fVar72;
              auVar93._4_4_ = (pfVar1[1] - fVar114) * fVar79;
              auVar93._8_4_ = (pfVar1[2] - fVar115) * fVar80;
              auVar93._12_4_ = (pfVar1[3] - fVar116) * fVar81;
              auVar60 = maxps(auVar60,auVar93);
              pfVar1 = (float *)(uVar31 + 0x20 + uVar28);
              auVar99._0_4_ = (*pfVar1 - fVar96) * fVar109;
              auVar99._4_4_ = (pfVar1[1] - fVar46) * fVar110;
              auVar99._8_4_ = (pfVar1[2] - fVar47) * fVar111;
              auVar99._12_4_ = (pfVar1[3] - fVar48) * fVar112;
              auVar67._4_4_ = fVar124;
              auVar67._0_4_ = fVar59;
              auVar67._8_4_ = fVar120;
              auVar67._12_4_ = fVar91;
              auVar67 = maxps(auVar99,auVar67);
              _local_1128 = maxps(auVar60,auVar67);
              pfVar1 = (float *)(uVar31 + 0x20 + uVar22);
              auVar68._0_4_ = (*pfVar1 - fVar51) * fVar97;
              auVar68._4_4_ = (pfVar1[1] - fVar52) * fVar100;
              auVar68._8_4_ = (pfVar1[2] - fVar53) * fVar101;
              auVar68._12_4_ = (pfVar1[3] - fVar54) * fVar102;
              pfVar1 = (float *)(uVar31 + 0x20 + uVar24);
              auVar73._0_4_ = (*pfVar1 - fVar113) * fVar55;
              auVar73._4_4_ = (pfVar1[1] - fVar114) * fVar56;
              auVar73._8_4_ = (pfVar1[2] - fVar115) * fVar57;
              auVar73._12_4_ = (pfVar1[3] - fVar116) * fVar58;
              auVar67 = minps(auVar68,auVar73);
              pfVar1 = (float *)(uVar31 + 0x20 + uVar25);
              auVar74._0_4_ = (*pfVar1 - fVar96) * fVar103;
              auVar74._4_4_ = (pfVar1[1] - fVar46) * fVar105;
              auVar74._8_4_ = (pfVar1[2] - fVar47) * fVar106;
              auVar74._12_4_ = (pfVar1[3] - fVar48) * fVar107;
              auVar60 = minps(auVar74,auVar66);
              auVar67 = minps(auVar67,auVar60);
              auVar85._4_4_ = -(uint)(local_1128._4_4_ <= auVar67._4_4_);
              auVar85._0_4_ = -(uint)(local_1128._0_4_ <= auVar67._0_4_);
              auVar85._8_4_ = -(uint)(local_1128._8_4_ <= auVar67._8_4_);
              auVar85._12_4_ = -(uint)(local_1128._12_4_ <= auVar67._12_4_);
              uVar17 = movmskps((int)local_1180,auVar85);
              local_1180 = CONCAT44((int)(local_1180 >> 0x20),uVar17);
            }
            if ((uVar31 & 8) == 0) {
              if (local_1180 == 0) {
                iVar18 = 4;
              }
              else {
                uVar30 = uVar31 & 0xfffffffffffffff0;
                lVar23 = 0;
                if (local_1180 != 0) {
                  for (; (local_1180 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                iVar18 = 0;
                uVar31 = *(ulong *)(uVar30 + lVar23 * 8);
                uVar26 = local_1180 - 1 & local_1180;
                if (uVar26 != 0) {
                  uVar34 = *(uint *)(local_1128 + lVar23 * 4);
                  lVar23 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                    }
                  }
                  uVar8 = *(ulong *)(uVar30 + lVar23 * 8);
                  uVar35 = *(uint *)(local_1128 + lVar23 * 4);
                  uVar26 = uVar26 - 1 & uVar26;
                  uVar24 = local_1260;
                  uVar25 = local_1268;
                  if (uVar26 == 0) {
                    if (uVar34 < uVar35) {
                      *(ulong *)*local_1270 = uVar8;
                      *(uint *)((long)*local_1270 + 8) = uVar35;
                      local_1270 = local_1270 + 1;
                    }
                    else {
                      *(ulong *)*local_1270 = uVar31;
                      *(uint *)((long)*local_1270 + 8) = uVar34;
                      uVar31 = uVar8;
                      local_1270 = local_1270 + 1;
                    }
                  }
                  else {
                    auVar61._8_4_ = uVar34;
                    auVar61._0_8_ = uVar31;
                    auVar61._12_4_ = 0;
                    auVar69._8_4_ = uVar35;
                    auVar69._0_8_ = uVar8;
                    auVar69._12_4_ = 0;
                    lVar23 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                      }
                    }
                    uVar31 = *(ulong *)(uVar30 + lVar23 * 8);
                    iVar6 = *(int *)(local_1128 + lVar23 * 4);
                    auVar75._8_4_ = iVar6;
                    auVar75._0_8_ = uVar31;
                    auVar75._12_4_ = 0;
                    auVar82._8_4_ = -(uint)((int)uVar34 < (int)uVar35);
                    uVar26 = uVar26 - 1 & uVar26;
                    fVar55 = local_11c8;
                    fVar56 = fStack_11c4;
                    fVar57 = fStack_11c0;
                    fVar58 = fStack_11bc;
                    if (uVar26 == 0) {
                      auVar82._4_4_ = auVar82._8_4_;
                      auVar82._0_4_ = auVar82._8_4_;
                      auVar82._12_4_ = auVar82._8_4_;
                      auVar67 = auVar61 & auVar82 | ~auVar82 & auVar69;
                      auVar60 = auVar69 & auVar82 | ~auVar82 & auVar61;
                      auVar83._8_4_ = -(uint)(auVar67._8_4_ < iVar6);
                      auVar83._0_8_ = CONCAT44(auVar83._8_4_,auVar83._8_4_);
                      auVar83._12_4_ = auVar83._8_4_;
                      uVar31 = ~auVar83._0_8_ & uVar31 | auVar67._0_8_ & auVar83._0_8_;
                      auVar67 = auVar75 & auVar83 | ~auVar83 & auVar67;
                      auVar62._8_4_ = -(uint)(auVar60._8_4_ < auVar67._8_4_);
                      auVar62._4_4_ = auVar62._8_4_;
                      auVar62._0_4_ = auVar62._8_4_;
                      auVar62._12_4_ = auVar62._8_4_;
                      *local_1270 = ~auVar62 & auVar60 | auVar67 & auVar62;
                      local_1270[1] = auVar60 & auVar62 | ~auVar62 & auVar67;
                      local_1270 = local_1270 + 2;
                    }
                    else {
                      lVar23 = 0;
                      if (uVar26 != 0) {
                        for (; (uVar26 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                        }
                      }
                      iVar7 = *(int *)(local_1128 + lVar23 * 4);
                      auVar92._8_4_ = iVar7;
                      auVar92._0_8_ = *(undefined8 *)(uVar30 + lVar23 * 8);
                      auVar92._12_4_ = 0;
                      auVar84._4_4_ = auVar82._8_4_;
                      auVar84._0_4_ = auVar82._8_4_;
                      auVar84._8_4_ = auVar82._8_4_;
                      auVar84._12_4_ = auVar82._8_4_;
                      auVar67 = auVar61 & auVar84 | ~auVar84 & auVar69;
                      auVar60 = auVar69 & auVar84 | ~auVar84 & auVar61;
                      auVar98._0_4_ = -(uint)(iVar6 < iVar7);
                      auVar98._4_4_ = -(uint)(iVar6 < iVar7);
                      auVar98._8_4_ = -(uint)(iVar6 < iVar7);
                      auVar98._12_4_ = -(uint)(iVar6 < iVar7);
                      auVar85 = auVar75 & auVar98 | ~auVar98 & auVar92;
                      auVar99 = ~auVar98 & auVar75 | auVar92 & auVar98;
                      auVar76._8_4_ = -(uint)(auVar60._8_4_ < auVar99._8_4_);
                      auVar76._4_4_ = auVar76._8_4_;
                      auVar76._0_4_ = auVar76._8_4_;
                      auVar76._12_4_ = auVar76._8_4_;
                      auVar93 = auVar60 & auVar76 | ~auVar76 & auVar99;
                      auVar70._8_4_ = -(uint)(auVar67._8_4_ < auVar85._8_4_);
                      auVar70._0_8_ = CONCAT44(auVar70._8_4_,auVar70._8_4_);
                      auVar70._12_4_ = auVar70._8_4_;
                      uVar31 = auVar67._0_8_ & auVar70._0_8_ | ~auVar70._0_8_ & auVar85._0_8_;
                      auVar67 = ~auVar70 & auVar67 | auVar85 & auVar70;
                      auVar63._8_4_ = -(uint)(auVar67._8_4_ < auVar93._8_4_);
                      auVar63._4_4_ = auVar63._8_4_;
                      auVar63._0_4_ = auVar63._8_4_;
                      auVar63._12_4_ = auVar63._8_4_;
                      *local_1270 = ~auVar76 & auVar60 | auVar99 & auVar76;
                      local_1270[1] = ~auVar63 & auVar67 | auVar93 & auVar63;
                      local_1270[2] = auVar67 & auVar63 | ~auVar63 & auVar93;
                      local_1270 = local_1270 + 3;
                      fVar72 = local_1138;
                      fVar79 = fStack_1134;
                      fVar80 = fStack_1130;
                      fVar81 = fStack_112c;
                      fVar97 = local_1148;
                      fVar100 = fStack_1144;
                      fVar101 = fStack_1140;
                      fVar102 = fStack_113c;
                    }
                  }
                }
              }
            }
            else {
              iVar18 = 6;
            }
          } while (iVar18 == 0);
        } while (iVar18 != 6);
        uVar20 = (ulong)((uint)uVar31 & 0xf) - 8;
        local_1188 = uVar20;
        if (uVar20 != 0) {
          uVar31 = uVar31 & 0xfffffffffffffff0;
          uVar27 = 0;
          do {
            lVar23 = uVar27 * 0xb0;
            local_10f8 = &local_1271;
            fVar59 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar124 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar120 = (ray->super_RayK<1>).org.field_0.m128[2];
            pfVar4 = (float *)(uVar31 + lVar23);
            pfVar1 = (float *)(uVar31 + 0x10 + lVar23);
            pfVar2 = (float *)(uVar31 + 0x20 + lVar23);
            pfVar3 = (float *)(uVar31 + 0x30 + lVar23);
            auStack_120c._4_4_ = *pfVar4 - fVar59;
            fStack_1204 = pfVar4[1] - fVar59;
            fStack_1200 = pfVar4[2] - fVar59;
            fStack_11fc = pfVar4[3] - fVar59;
            local_f88 = *pfVar1 - fVar124;
            fStack_f84 = pfVar1[1] - fVar124;
            fStack_f80 = pfVar1[2] - fVar124;
            fStack_f7c = pfVar1[3] - fVar124;
            local_f98 = *pfVar2 - fVar120;
            fStack_f94 = pfVar2[1] - fVar120;
            fStack_f90 = pfVar2[2] - fVar120;
            fStack_f8c = pfVar2[3] - fVar120;
            local_11b8 = *pfVar3 - fVar59;
            fStack_11b4 = pfVar3[1] - fVar59;
            fStack_11b0 = pfVar3[2] - fVar59;
            fStack_11ac = pfVar3[3] - fVar59;
            pfVar1 = (float *)(uVar31 + 0x40 + lVar23);
            fVar46 = *pfVar1 - fVar124;
            fVar51 = pfVar1[1] - fVar124;
            fVar54 = pfVar1[2] - fVar124;
            fVar57 = pfVar1[3] - fVar124;
            pfVar1 = (float *)(uVar31 + 0x50 + lVar23);
            fVar47 = *pfVar1 - fVar120;
            fVar52 = pfVar1[1] - fVar120;
            fVar55 = pfVar1[2] - fVar120;
            fVar58 = pfVar1[3] - fVar120;
            pfVar1 = (float *)(uVar31 + 0x60 + lVar23);
            fVar48 = *pfVar1 - fVar59;
            fVar53 = pfVar1[1] - fVar59;
            fVar56 = pfVar1[2] - fVar59;
            fVar59 = pfVar1[3] - fVar59;
            pfVar1 = (float *)(uVar31 + 0x70 + lVar23);
            fVar121 = *pfVar1 - fVar124;
            fVar122 = pfVar1[1] - fVar124;
            fVar123 = pfVar1[2] - fVar124;
            fVar124 = pfVar1[3] - fVar124;
            pfVar1 = (float *)(uVar31 + 0x80 + lVar23);
            fVar117 = *pfVar1 - fVar120;
            fVar118 = pfVar1[1] - fVar120;
            fVar119 = pfVar1[2] - fVar120;
            fVar120 = pfVar1[3] - fVar120;
            local_fa8 = fVar48 - (float)auStack_120c._4_4_;
            fStack_fa4 = fVar53 - fStack_1204;
            fStack_fa0 = fVar56 - fStack_1200;
            fStack_f9c = fVar59 - fStack_11fc;
            local_fc8 = fVar121 - local_f88;
            fStack_fc4 = fVar122 - fStack_f84;
            fStack_fc0 = fVar123 - fStack_f80;
            fStack_fbc = fVar124 - fStack_f7c;
            local_fb8 = fVar117 - local_f98;
            fStack_fb4 = fVar118 - fStack_f94;
            fStack_fb0 = fVar119 - fStack_f90;
            fStack_fac = fVar120 - fStack_f8c;
            fVar91 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar96 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1234 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_1218 = (local_fc8 * (local_f98 + fVar117) - (local_f88 + fVar121) * local_fb8) *
                         fVar91 + (((float)auStack_120c._4_4_ + fVar48) * local_fb8 -
                                  (local_f98 + fVar117) * local_fa8) * fVar96 +
                                  (local_fa8 * (local_f88 + fVar121) -
                                  ((float)auStack_120c._4_4_ + fVar48) * local_fc8) * fStack_1234;
            fStack_1214 = (fStack_fc4 * (fStack_f94 + fVar118) - (fStack_f84 + fVar122) * fStack_fb4
                          ) * fVar91 +
                          ((fStack_1204 + fVar53) * fStack_fb4 - (fStack_f94 + fVar118) * fStack_fa4
                          ) * fVar96 +
                          (fStack_fa4 * (fStack_f84 + fVar122) - (fStack_1204 + fVar53) * fStack_fc4
                          ) * fStack_1234;
            fStack_1210 = (fStack_fc0 * (fStack_f90 + fVar119) - (fStack_f80 + fVar123) * fStack_fb0
                          ) * fVar91 +
                          ((fStack_1200 + fVar56) * fStack_fb0 - (fStack_f90 + fVar119) * fStack_fa0
                          ) * fVar96 +
                          (fStack_fa0 * (fStack_f80 + fVar123) - (fStack_1200 + fVar56) * fStack_fc0
                          ) * fStack_1234;
            auStack_120c._0_4_ =
                 (fStack_fbc * (fStack_f8c + fVar120) - (fStack_f7c + fVar124) * fStack_fac) *
                 fVar91 + ((fStack_11fc + fVar59) * fStack_fac - (fStack_f8c + fVar120) * fStack_f9c
                          ) * fVar96 +
                          (fStack_f9c * (fStack_f7c + fVar124) - (fStack_11fc + fVar59) * fStack_fbc
                          ) * fStack_1234;
            local_fd8 = (float)auStack_120c._4_4_ - local_11b8;
            fStack_fd4 = fStack_1204 - fStack_11b4;
            fStack_fd0 = fStack_1200 - fStack_11b0;
            fStack_fcc = fStack_11fc - fStack_11ac;
            fVar97 = local_f88 - fVar46;
            fVar100 = fStack_f84 - fVar51;
            fVar101 = fStack_f80 - fVar54;
            fVar102 = fStack_f7c - fVar57;
            fVar113 = local_f98 - fVar47;
            fVar114 = fStack_f94 - fVar52;
            fVar115 = fStack_f90 - fVar55;
            fVar116 = fStack_f8c - fVar58;
            fVar109 = (fVar97 * (local_f98 + fVar47) - (local_f88 + fVar46) * fVar113) * fVar91 +
                      (((float)auStack_120c._4_4_ + local_11b8) * fVar113 -
                      (local_f98 + fVar47) * local_fd8) * fVar96 +
                      (local_fd8 * (local_f88 + fVar46) -
                      ((float)auStack_120c._4_4_ + local_11b8) * fVar97) * fStack_1234;
            fVar110 = (fVar100 * (fStack_f94 + fVar52) - (fStack_f84 + fVar51) * fVar114) * fVar91 +
                      ((fStack_1204 + fStack_11b4) * fVar114 - (fStack_f94 + fVar52) * fStack_fd4) *
                      fVar96 + (fStack_fd4 * (fStack_f84 + fVar51) -
                               (fStack_1204 + fStack_11b4) * fVar100) * fStack_1234;
            fVar111 = (fVar101 * (fStack_f90 + fVar55) - (fStack_f80 + fVar54) * fVar115) * fVar91 +
                      ((fStack_1200 + fStack_11b0) * fVar115 - (fStack_f90 + fVar55) * fStack_fd0) *
                      fVar96 + (fStack_fd0 * (fStack_f80 + fVar54) -
                               (fStack_1200 + fStack_11b0) * fVar101) * fStack_1234;
            fVar112 = (fVar102 * (fStack_f8c + fVar58) - (fStack_f7c + fVar57) * fVar116) * fVar91 +
                      ((fStack_11fc + fStack_11ac) * fVar116 - (fStack_f8c + fVar58) * fStack_fcc) *
                      fVar96 + (fStack_fcc * (fStack_f7c + fVar57) -
                               (fStack_11fc + fStack_11ac) * fVar102) * fStack_1234;
            fVar72 = local_11b8 - fVar48;
            fVar79 = fStack_11b4 - fVar53;
            fVar80 = fStack_11b0 - fVar56;
            fVar81 = fStack_11ac - fVar59;
            local_ff8 = fVar46 - fVar121;
            fStack_ff4 = fVar51 - fVar122;
            fStack_ff0 = fVar54 - fVar123;
            fStack_fec = fVar57 - fVar124;
            fVar103 = fVar47 - fVar117;
            fVar105 = fVar52 - fVar118;
            fVar106 = fVar55 - fVar119;
            fVar107 = fVar58 - fVar120;
            local_123c._4_4_ = fStack_1234;
            uStack_1230 = fStack_1234;
            auStack_122c._0_4_ = fStack_1234;
            auVar64._0_4_ =
                 (local_ff8 * (fVar117 + fVar47) - (fVar121 + fVar46) * fVar103) * fVar91 +
                 ((fVar48 + local_11b8) * fVar103 - (fVar117 + fVar47) * fVar72) * fVar96 +
                 (fVar72 * (fVar121 + fVar46) - (fVar48 + local_11b8) * local_ff8) * fStack_1234;
            auVar64._4_4_ =
                 (fStack_ff4 * (fVar118 + fVar52) - (fVar122 + fVar51) * fVar105) * fVar91 +
                 ((fVar53 + fStack_11b4) * fVar105 - (fVar118 + fVar52) * fVar79) * fVar96 +
                 (fVar79 * (fVar122 + fVar51) - (fVar53 + fStack_11b4) * fStack_ff4) * fStack_1234;
            auVar64._8_4_ =
                 (fStack_ff0 * (fVar119 + fVar55) - (fVar123 + fVar54) * fVar106) * fVar91 +
                 ((fVar56 + fStack_11b0) * fVar106 - (fVar119 + fVar55) * fVar80) * fVar96 +
                 (fVar80 * (fVar123 + fVar54) - (fVar56 + fStack_11b0) * fStack_ff0) * fStack_1234;
            auVar64._12_4_ =
                 (fStack_fec * (fVar120 + fVar58) - (fVar124 + fVar57) * fVar107) * fVar91 +
                 ((fVar59 + fStack_11ac) * fVar107 - (fVar120 + fVar58) * fVar81) * fVar96 +
                 (fVar81 * (fVar124 + fVar57) - (fVar59 + fStack_11ac) * fStack_fec) * fStack_1234;
            auVar15._4_4_ = fStack_1214;
            auVar15._0_4_ = local_1218;
            auVar15._8_4_ = fStack_1210;
            auVar15._12_4_ = auStack_120c._0_4_;
            fVar59 = fVar109 + local_1218 + auVar64._0_4_;
            fVar124 = fVar110 + fStack_1214 + auVar64._4_4_;
            uVar65 = CONCAT44(fVar124,fVar59);
            fVar120 = fVar111 + fStack_1210 + auVar64._8_4_;
            fVar46 = fVar112 + (float)auStack_120c._0_4_ + auVar64._12_4_;
            auVar12._4_4_ = fVar110;
            auVar12._0_4_ = fVar109;
            auVar12._8_4_ = fVar111;
            auVar12._12_4_ = fVar112;
            auVar66 = minps(auVar15,auVar12);
            auVar67 = minps(auVar66,auVar64);
            auVar13._4_4_ = fVar110;
            auVar13._0_4_ = fVar109;
            auVar13._8_4_ = fVar111;
            auVar13._12_4_ = fVar112;
            auVar66 = maxps(auVar15,auVar13);
            auVar66 = maxps(auVar66,auVar64);
            local_fe8 = ABS(fVar59);
            fStack_fe4 = ABS(fVar124);
            fStack_fe0 = ABS(fVar120);
            fStack_fdc = ABS(fVar46);
            auVar49._4_4_ = -(uint)(auVar66._4_4_ <= fStack_fe4 * 1.1920929e-07);
            auVar49._0_4_ = -(uint)(auVar66._0_4_ <= local_fe8 * 1.1920929e-07);
            auVar49._8_4_ = -(uint)(auVar66._8_4_ <= fStack_fe0 * 1.1920929e-07);
            auVar49._12_4_ = -(uint)(auVar66._12_4_ <= fStack_fdc * 1.1920929e-07);
            auVar94._4_4_ = -(uint)(-(fStack_fe4 * 1.1920929e-07) <= auVar67._4_4_);
            auVar94._0_4_ = -(uint)(-(local_fe8 * 1.1920929e-07) <= auVar67._0_4_);
            auVar94._8_4_ = -(uint)(-(fStack_fe0 * 1.1920929e-07) <= auVar67._8_4_);
            auVar94._12_4_ = -(uint)(-(fStack_fdc * 1.1920929e-07) <= auVar67._12_4_);
            auVar49 = auVar49 | auVar94;
            auVar50._0_4_ = auVar49._0_4_ & local_1008;
            auVar50._4_4_ = auVar49._4_4_ & uStack_1004;
            auVar50._8_4_ = auVar49._8_4_ & uStack_1000;
            auVar50._12_4_ = auVar49._12_4_ & uStack_ffc;
            uVar17 = (undefined4)(uVar20 >> 0x20);
            iVar18 = movmskps((int)uVar20,auVar50);
            uVar20 = CONCAT44(uVar17,iVar18);
            if (iVar18 != 0) {
              auVar104._8_4_ = fVar120;
              auVar104._0_8_ = uVar65;
              auVar104._12_4_ = fVar46;
              local_11b8 = fVar109;
              fStack_11b4 = fVar110;
              fStack_11b0 = fVar111;
              fStack_11ac = fVar112;
              uVar34 = -(uint)(ABS(fVar113 * local_ff8) <= ABS(fVar97 * local_fb8));
              uVar36 = -(uint)(ABS(fVar114 * fStack_ff4) <= ABS(fVar100 * fStack_fb4));
              uVar40 = -(uint)(ABS(fVar115 * fStack_ff0) <= ABS(fVar101 * fStack_fb0));
              uVar43 = -(uint)(ABS(fVar116 * fStack_fec) <= ABS(fVar102 * fStack_fac));
              uVar35 = -(uint)(ABS(local_fd8 * fVar103) <= ABS(fVar113 * local_fa8));
              uVar37 = -(uint)(ABS(fStack_fd4 * fVar105) <= ABS(fVar114 * fStack_fa4));
              uVar41 = -(uint)(ABS(fStack_fd0 * fVar106) <= ABS(fVar115 * fStack_fa0));
              uVar44 = -(uint)(ABS(fStack_fcc * fVar107) <= ABS(fVar116 * fStack_f9c));
              uVar39 = -(uint)(ABS(fVar97 * fVar72) <= ABS(local_fd8 * local_fc8));
              uVar38 = -(uint)(ABS(fVar100 * fVar79) <= ABS(fStack_fd4 * fStack_fc4));
              uVar42 = -(uint)(ABS(fVar101 * fVar80) <= ABS(fStack_fd0 * fStack_fc0));
              uVar45 = -(uint)(ABS(fVar102 * fVar81) <= ABS(fStack_fcc * fStack_fbc));
              local_10a8[0] =
                   (float)(~uVar34 & (uint)(local_fc8 * fVar113 - fVar97 * local_fb8) |
                          (uint)(fVar97 * fVar103 - fVar113 * local_ff8) & uVar34);
              local_10a8[1] =
                   (float)(~uVar36 & (uint)(fStack_fc4 * fVar114 - fVar100 * fStack_fb4) |
                          (uint)(fVar100 * fVar105 - fVar114 * fStack_ff4) & uVar36);
              local_10a8[2] =
                   (float)(~uVar40 & (uint)(fStack_fc0 * fVar115 - fVar101 * fStack_fb0) |
                          (uint)(fVar101 * fVar106 - fVar115 * fStack_ff0) & uVar40);
              local_10a8[3] =
                   (float)(~uVar43 & (uint)(fStack_fbc * fVar116 - fVar102 * fStack_fac) |
                          (uint)(fVar102 * fVar107 - fVar116 * fStack_fec) & uVar43);
              local_1118._4_4_ = fVar110;
              local_1118._0_4_ = fVar109;
              local_1118._8_4_ = fVar111;
              local_1118._12_4_ = fVar112;
              local_1098[0] =
                   (float)(~uVar35 & (uint)(local_fb8 * local_fd8 - fVar113 * local_fa8) |
                          (uint)(fVar113 * fVar72 - local_fd8 * fVar103) & uVar35);
              local_1098[1] =
                   (float)(~uVar37 & (uint)(fStack_fb4 * fStack_fd4 - fVar114 * fStack_fa4) |
                          (uint)(fVar114 * fVar79 - fStack_fd4 * fVar105) & uVar37);
              local_1098[2] =
                   (float)(~uVar41 & (uint)(fStack_fb0 * fStack_fd0 - fVar115 * fStack_fa0) |
                          (uint)(fVar115 * fVar80 - fStack_fd0 * fVar106) & uVar41);
              local_1098[3] =
                   (float)(~uVar44 & (uint)(fStack_fac * fStack_fcc - fVar116 * fStack_f9c) |
                          (uint)(fVar116 * fVar81 - fStack_fcc * fVar107) & uVar44);
              local_1088[0] =
                   (float)(~uVar39 & (uint)(local_fa8 * fVar97 - local_fd8 * local_fc8) |
                          (uint)(local_fd8 * local_ff8 - fVar97 * fVar72) & uVar39);
              local_1088[1] =
                   (float)(~uVar38 & (uint)(fStack_fa4 * fVar100 - fStack_fd4 * fStack_fc4) |
                          (uint)(fStack_fd4 * fStack_ff4 - fVar100 * fVar79) & uVar38);
              local_1088[2] =
                   (float)(~uVar42 & (uint)(fStack_fa0 * fVar101 - fStack_fd0 * fStack_fc0) |
                          (uint)(fStack_fd0 * fStack_ff0 - fVar101 * fVar80) & uVar42);
              local_1088[3] =
                   (float)(~uVar45 & (uint)(fStack_f9c * fVar102 - fStack_fcc * fStack_fbc) |
                          (uint)(fStack_fcc * fStack_fec - fVar102 * fVar81) & uVar45);
              fVar47 = fVar91 * local_10a8[0] + fVar96 * local_1098[0] + fStack_1234 * local_1088[0]
              ;
              fVar48 = fVar91 * local_10a8[1] + fVar96 * local_1098[1] + fStack_1234 * local_1088[1]
              ;
              fVar51 = fVar91 * local_10a8[2] + fVar96 * local_1098[2] + fStack_1234 * local_1088[2]
              ;
              fVar91 = fVar91 * local_10a8[3] + fVar96 * local_1098[3] + fStack_1234 * local_1088[3]
              ;
              auVar86._0_4_ = fVar47 + fVar47;
              auVar86._4_4_ = fVar48 + fVar48;
              auVar86._8_4_ = fVar51 + fVar51;
              auVar86._12_4_ = fVar91 + fVar91;
              fVar91 = (float)auStack_120c._4_4_ * local_10a8[0] +
                       local_f88 * local_1098[0] + local_f98 * local_1088[0];
              fVar96 = fStack_1204 * local_10a8[1] +
                       fStack_f84 * local_1098[1] + fStack_f94 * local_1088[1];
              fVar47 = fStack_1200 * local_10a8[2] +
                       fStack_f80 * local_1098[2] + fStack_f90 * local_1088[2];
              fVar48 = fStack_11fc * local_10a8[3] +
                       fStack_f7c * local_1098[3] + fStack_f8c * local_1088[3];
              auVar66 = rcpps(auVar104,auVar86);
              fVar51 = auVar66._0_4_;
              fVar52 = auVar66._4_4_;
              fVar53 = auVar66._8_4_;
              fVar54 = auVar66._12_4_;
              local_1258 = ((1.0 - auVar86._0_4_ * fVar51) * fVar51 + fVar51) * (fVar91 + fVar91);
              fStack_1254 = ((1.0 - auVar86._4_4_ * fVar52) * fVar52 + fVar52) * (fVar96 + fVar96);
              fStack_1250 = ((1.0 - auVar86._8_4_ * fVar53) * fVar53 + fVar53) * (fVar47 + fVar47);
              fStack_124c = ((1.0 - auVar86._12_4_ * fVar54) * fVar54 + fVar54) * (fVar48 + fVar48);
              fVar91 = (ray->super_RayK<1>).tfar;
              fVar96 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar87._0_4_ =
                   (int)((uint)(auVar86._0_4_ != 0.0 &&
                               (local_1258 <= fVar91 && fVar96 <= local_1258)) * -0x80000000) >>
                   0x1f;
              auVar87._4_4_ =
                   (int)((uint)(auVar86._4_4_ != 0.0 &&
                               (fStack_1254 <= fVar91 && fVar96 <= fStack_1254)) * -0x80000000) >>
                   0x1f;
              auVar87._8_4_ =
                   (int)((uint)(auVar86._8_4_ != 0.0 &&
                               (fStack_1250 <= fVar91 && fVar96 <= fStack_1250)) * -0x80000000) >>
                   0x1f;
              auVar87._12_4_ =
                   (int)((uint)(auVar86._12_4_ != 0.0 &&
                               (fStack_124c <= fVar91 && fVar96 <= fStack_124c)) * -0x80000000) >>
                   0x1f;
              auVar88 = auVar87 & auVar50;
              iVar18 = movmskps(iVar18,auVar88);
              uVar20 = CONCAT44(uVar17,iVar18);
              if (iVar18 != 0) {
                local_1128._4_4_ = fStack_1214;
                local_1128._0_4_ = local_1218;
                fStack_1120 = fStack_1210;
                fStack_111c = (float)auStack_120c._0_4_;
                local_1108._8_4_ = fVar120;
                local_1108._0_8_ = uVar65;
                local_1108._12_4_ = fVar46;
                local_10e8 = auVar88;
                local_10b8[0] = local_1258;
                local_10b8[1] = fStack_1254;
                local_10b8[2] = fStack_1250;
                local_10b8[3] = fStack_124c;
                uVar33 = context->scene;
                uVar34 = auVar88._0_4_;
                uVar35 = auVar88._4_4_;
                uVar39 = auVar88._8_4_;
                uVar36 = auVar88._12_4_;
                stack0xffffffffffffedd8 = auVar88;
                auVar14._8_4_ = fVar120;
                auVar14._0_8_ = uVar65;
                auVar14._12_4_ = fVar46;
                auVar66 = rcpps(auVar88,auVar14);
                fVar91 = auVar66._0_4_;
                fVar96 = auVar66._4_4_;
                fVar47 = auVar66._8_4_;
                fVar48 = auVar66._12_4_;
                fVar59 = (float)(-(uint)(1e-18 <= local_fe8) &
                                (uint)(((float)DAT_01feca10 - fVar59 * fVar91) * fVar91 + fVar91));
                fVar124 = (float)(-(uint)(1e-18 <= fStack_fe4) &
                                 (uint)((DAT_01feca10._4_4_ - fVar124 * fVar96) * fVar96 + fVar96));
                fVar120 = (float)(-(uint)(1e-18 <= fStack_fe0) &
                                 (uint)((DAT_01feca10._8_4_ - fVar120 * fVar47) * fVar47 + fVar47));
                fVar91 = (float)(-(uint)(1e-18 <= fStack_fdc) &
                                (uint)((DAT_01feca10._12_4_ - fVar46 * fVar48) * fVar48 + fVar48));
                auVar95._0_4_ = local_1218 * fVar59;
                auVar95._4_4_ = fStack_1214 * fVar124;
                auVar95._8_4_ = fStack_1210 * fVar120;
                auVar95._12_4_ = (float)auStack_120c._0_4_ * fVar91;
                local_10d8 = minps(auVar95,_DAT_01feca10);
                auVar108._0_4_ = fVar59 * fVar109;
                auVar108._4_4_ = fVar124 * fVar110;
                auVar108._8_4_ = fVar120 * fVar111;
                auVar108._12_4_ = fVar91 * fVar112;
                local_10c8 = minps(auVar108,_DAT_01feca10);
                auVar77._0_4_ = (uint)local_1258 & uVar34;
                auVar77._4_4_ = (uint)fStack_1254 & uVar35;
                auVar77._8_4_ = (uint)fStack_1250 & uVar39;
                auVar77._12_4_ = (uint)fStack_124c & uVar36;
                auVar71._0_8_ = CONCAT44(~uVar35,~uVar34) & 0x7f8000007f800000;
                auVar71._8_4_ = ~uVar39 & 0x7f800000;
                auVar71._12_4_ = ~uVar36 & 0x7f800000;
                auVar71 = auVar71 | auVar77;
                auVar78._4_4_ = auVar71._0_4_;
                auVar78._0_4_ = auVar71._4_4_;
                auVar78._8_4_ = auVar71._12_4_;
                auVar78._12_4_ = auVar71._8_4_;
                auVar66 = minps(auVar78,auVar71);
                auVar89._0_8_ = auVar66._8_8_;
                auVar89._8_4_ = auVar66._0_4_;
                auVar89._12_4_ = auVar66._4_4_;
                auVar66 = minps(auVar89,auVar66);
                auVar90._0_8_ =
                     CONCAT44(-(uint)(auVar66._4_4_ == auVar71._4_4_) & uVar35,
                              -(uint)(auVar66._0_4_ == auVar71._0_4_) & uVar34);
                auVar90._8_4_ = -(uint)(auVar66._8_4_ == auVar71._8_4_) & uVar39;
                auVar90._12_4_ = -(uint)(auVar66._12_4_ == auVar71._12_4_) & uVar36;
                iVar18 = movmskps(iVar18,auVar90);
                if (iVar18 != 0) {
                  auVar88._8_4_ = auVar90._8_4_;
                  auVar88._0_8_ = auVar90._0_8_;
                  auVar88._12_4_ = auVar90._12_4_;
                }
                lVar23 = lVar23 + uVar31;
                uVar19 = movmskps(iVar18,auVar88);
                pRVar29 = (RayHit *)0x0;
                if (CONCAT44(uVar17,uVar19) != 0) {
                  for (; (CONCAT44(uVar17,uVar19) >> (long)pRVar29 & 1) == 0;
                      pRVar29 = (RayHit *)((long)(pRVar29->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                stack0xffffffffffffedf8 = uVar33;
                do {
                  uVar34 = *(uint *)(lVar23 + 0x90 + (long)pRVar29 * 4);
                  pRVar21 = (RayHit *)(ulong)uVar34;
                  pGVar9 = (((Scene *)uVar33)->geometries).items[(long)pRVar21].ptr;
                  if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(auStack_122c + (long)pRVar29 * 4 + 4) = 0;
                  }
                  else {
                    pRVar10 = context->args;
                    if ((pRVar10->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar59 = *(float *)(local_10d8 + (long)pRVar29 * 4);
                      fVar124 = *(float *)(local_10c8 + (long)pRVar29 * 4);
                      (ray->super_RayK<1>).tfar = local_10b8[(long)pRVar29];
                      (ray->Ng).field_0.field_0.x = local_10a8[(long)pRVar29];
                      (ray->Ng).field_0.field_0.y = local_1098[(long)pRVar29];
                      (ray->Ng).field_0.field_0.z = local_1088[(long)pRVar29];
                      ray->u = fVar59;
                      ray->v = fVar124;
                      ray->primID = *(uint *)(lVar23 + 0xa0 + (long)pRVar29 * 4);
                      ray->geomID = uVar34;
                      pRVar11 = context->user;
                      ray->instID[0] = pRVar11->instID[0];
                      uVar34 = pRVar11->instPrimID[0];
                      uVar20 = (ulong)uVar34;
                      ray->instPrimID[0] = uVar34;
                      break;
                    }
                    local_11f8.context = context->user;
                    local_1178 = local_10a8[(long)pRVar29];
                    local_1174 = local_1098[(long)pRVar29];
                    local_1170 = local_1088[(long)pRVar29];
                    local_116c = *(undefined4 *)(local_10d8 + (long)pRVar29 * 4);
                    local_1168 = *(undefined4 *)(local_10c8 + (long)pRVar29 * 4);
                    local_1164 = *(undefined4 *)(lVar23 + 0xa0 + (long)pRVar29 * 4);
                    local_1160 = uVar34;
                    local_115c = (local_11f8.context)->instID[0];
                    local_1158 = (local_11f8.context)->instPrimID[0];
                    local_1218 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = local_10b8[(long)pRVar29];
                    local_123c._0_4_ = -NAN;
                    local_11f8.valid = (int *)local_123c;
                    local_11f8.geometryUserPtr = pGVar9->userPtr;
                    local_11f8.ray = (RTCRayN *)ray;
                    local_11f8.hit = (RTCHitN *)&local_1178;
                    local_11f8.N = 1;
                    if ((pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       (unique0x100023e6 = uVar27, (*pGVar9->intersectionFilterN)(&local_11f8),
                       context = local_1248, uVar24 = local_1260, uVar25 = local_1268,
                       uVar27 = stack0xffffffffffffedc8,
                       (((RayK<1> *)local_11f8.valid)->org).field_0.m128[0] != 0.0)) {
                      if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar10->filter)(&local_11f8);
                          context = local_1248;
                          uVar24 = local_1260;
                          uVar25 = local_1268;
                        }
                        if ((((RayK<1> *)local_11f8.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00dea57a;
                      }
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11f8.hit;
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11f8.hit + 4);
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11f8.hit + 8);
                      *(float *)((long)local_11f8.ray + 0x3c) = *(float *)(local_11f8.hit + 0xc);
                      *(float *)((long)local_11f8.ray + 0x40) = *(float *)(local_11f8.hit + 0x10);
                      *(float *)((long)local_11f8.ray + 0x44) = *(float *)(local_11f8.hit + 0x14);
                      *(float *)((long)local_11f8.ray + 0x48) = *(float *)(local_11f8.hit + 0x18);
                      *(float *)((long)local_11f8.ray + 0x4c) = *(float *)(local_11f8.hit + 0x1c);
                      *(float *)((long)local_11f8.ray + 0x50) = *(float *)(local_11f8.hit + 0x20);
                      pRVar21 = (RayHit *)local_11f8.ray;
                    }
                    else {
LAB_00dea57a:
                      (ray->super_RayK<1>).tfar = local_1218;
                      pRVar21 = (RayHit *)local_11f8.valid;
                    }
                    *(undefined4 *)(auStack_122c + (long)pRVar29 * 4 + 4) = 0;
                    fVar59 = (ray->super_RayK<1>).tfar;
                    auStack_122c._4_4_ = -(uint)(local_1258 <= fVar59) & auStack_122c._4_4_;
                    auStack_122c._8_4_ = -(uint)(fStack_1254 <= fVar59) & auStack_122c._8_4_;
                    auStack_122c._12_4_ = -(uint)(fStack_1250 <= fVar59) & auStack_122c._12_4_;
                    fStack_121c = (float)(-(uint)(fStack_124c <= fVar59) & (uint)fStack_121c);
                    uVar33 = stack0xffffffffffffedf8;
                  }
                  iVar18 = movmskps((int)pRVar21,stack0xffffffffffffedd8);
                  uVar20 = CONCAT44((int)((ulong)pRVar21 >> 0x20),iVar18);
                  if (iVar18 == 0) break;
                  BVHNIntersector1<4,1,true,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvIntersector1Pluecker<4,true>>>
                  ::intersect();
                  context = local_1248;
                  uVar24 = local_1260;
                  uVar25 = local_1268;
                  pRVar29 = (RayHit *)local_11f8.valid;
                } while( true );
              }
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != local_1188);
        }
        fVar59 = (ray->super_RayK<1>).tfar;
        auVar66._4_4_ = fVar59;
        auVar66._0_4_ = fVar59;
        auVar66._8_4_ = fVar59;
        auVar66._12_4_ = fVar59;
        uVar20 = local_1190;
        uVar22 = local_11a8;
        uVar28 = local_11a0;
        uVar32 = local_1198;
        fVar59 = local_1018;
        fVar124 = fStack_1014;
        fVar120 = fStack_1010;
        fVar91 = fStack_100c;
        fVar96 = local_1038;
        fVar46 = fStack_1034;
        fVar47 = fStack_1030;
        fVar48 = fStack_102c;
        fVar51 = local_1058;
        fVar52 = fStack_1054;
        fVar53 = fStack_1050;
        fVar54 = fStack_104c;
        fVar55 = local_11c8;
        fVar56 = fStack_11c4;
        fVar57 = fStack_11c0;
        fVar58 = fStack_11bc;
        fVar72 = local_1138;
        fVar79 = fStack_1134;
        fVar80 = fStack_1130;
        fVar81 = fStack_112c;
        fVar97 = local_1148;
        fVar100 = fStack_1144;
        fVar101 = fStack_1140;
        fVar102 = fStack_113c;
        fVar103 = local_1028;
        fVar105 = fStack_1024;
        fVar106 = fStack_1020;
        fVar107 = fStack_101c;
        fVar109 = local_1048;
        fVar110 = fStack_1044;
        fVar111 = fStack_1040;
        fVar112 = fStack_103c;
        fVar113 = local_1068;
        fVar114 = fStack_1064;
        fVar115 = fStack_1060;
        fVar116 = fStack_105c;
        fVar117 = local_1078;
        fVar118 = fStack_1074;
        fVar119 = fStack_1070;
        fVar121 = fStack_106c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }